

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::RandCaseStatementSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,RandCaseStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_70;
  SyntaxNode *local_60;
  size_t index_local;
  RandCaseStatementSyntax *this_local;
  
  switch(index) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&((this->super_StatementSyntax).label)->super_SyntaxNode);
    break;
  case 1:
    local_60 = (SyntaxNode *)0x0;
    if (this != (RandCaseStatementSyntax *)0xffffffffffffffe8) {
      local_60 = &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 2:
    token.kind = (this->randCase).kind;
    token._2_1_ = (this->randCase).field_0x2;
    token.numFlags.raw = (this->randCase).numFlags.raw;
    token.rawLen = (this->randCase).rawLen;
    token.info = (this->randCase).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    local_70 = (SyntaxNode *)0x0;
    if (this != (RandCaseStatementSyntax *)0xffffffffffffffa8) {
      local_70 = &(this->items).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 4:
    token_00.kind = (this->endCase).kind;
    token_00._2_1_ = (this->endCase).field_0x2;
    token_00.numFlags.raw = (this->endCase).numFlags.raw;
    token_00.rawLen = (this->endCase).rawLen;
    token_00.info = (this->endCase).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax RandCaseStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return randCase;
        case 3: return &items;
        case 4: return endCase;
        default: return nullptr;
    }
}